

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval_heap.hpp
# Opt level: O3

bool boost::heap::
     is_interval_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
               (undefined8 param_1,int *last)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  
  _Var1 = is_interval_heap_until<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                    ();
  return _Var1._M_current == last;
}

Assistant:

bool is_interval_heap (Iterator first, Iterator last, Compare compare) {
  try {
    return (is_interval_heap_until<Iterator,Compare>(first, last, compare)
            == last);
  } catch (...) {
    return false;
  }
}